

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noccout.c
# Opt level: O2

void debugprintitem(Item *q)

{
  short sVar1;
  long *plVar2;
  char *__format;
  
  while( true ) {
    sVar1 = ((Symbol *)q)->type;
    if (sVar1 != 2) break;
    printf("ITM ");
    q = (Item *)((anon_union_8_4_46e41722_for_element *)&((Symbol *)q)->subtype)->sym;
  }
  if (sVar1 == 0x102) {
    plVar2 = &((Symbol *)q)->subtype;
    __format = "VERB %s\n";
  }
  else if (sVar1 == 1) {
    plVar2 = (long *)(((Symbol *)q)->subtype + 0x48);
    __format = "SYM %s\n";
  }
  else {
    plVar2 = &((Symbol *)q)->subtype;
    __format = "STR %s\n";
  }
  printf(__format,*plVar2);
  return;
}

Assistant:

void debugprintitem(q) Item* q; {
		if (q->itemtype == SYMBOL) {
			printf("SYM %s\n", SYM(q)->name);
		} else if (q->itemtype == VERBATIM) {
			printf("VERB %s\n",STR(q));
		} else if (q->itemtype == ITEM) {
			printf("ITM ");
			debugprintitem(ITM(q));
		}else {
			printf("STR %s\n", STR(q));
		}
}